

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_toint(jit_State *J,TRef tr)

{
  TRef TVar1;
  TraceError in_ESI;
  jit_State *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe8;
  IRRef mode;
  uint in_stack_fffffffffffffff0;
  TRef in_stack_fffffffffffffff4;
  jit_State *in_stack_fffffffffffffff8;
  
  mode = (IRRef)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if ((in_ESI & 0x1f000000) == 0x4000000) {
    in_stack_fffffffffffffff4 = CONCAT22(0x588e,(IRRef1)in_ESI);
    in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 & 0xffff;
    (in_RDI->fold).ins.field_0.ot = 0x588e;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0;
    in_stack_fffffffffffffff8 = in_RDI;
    in_ESI = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
    ;
  }
  if ((in_ESI & 0x1f000000) == 0xe000000) {
    (in_RDI->fold).ins.field_0.ot = 0x5513;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0x126e;
    TVar1 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    if (4 < (in_ESI >> 0x18 & 0x1f) - 0xf) {
      lj_trace_err(in_RDI,in_ESI);
    }
    TVar1 = narrow_stripov(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4,
                           in_stack_fffffffffffffff0,mode);
  }
  return TVar1;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_toint(jit_State *J, TRef tr)
{
  if (tref_isstr(tr))
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_ANY);
  if (!tref_isinteger(tr))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  /*
  ** Undefined overflow semantics allow stripping of ADDOV, SUBOV and MULOV.
  ** Use IRCONV_TOBIT for the cache entries, since the semantics are the same.
  */
  return narrow_stripov(J, tr, IR_MULOV, (IRT_INT<<5)|IRT_INT|IRCONV_TOBIT);
}